

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

mat4 * __thiscall Camera::getViewMatrix(mat4 *__return_storage_ptr__,Camera *this)

{
  tvec3<float,_(glm::precision)0> *v;
  tvec3<float,_(glm::precision)0> *in_R8;
  double dVar1;
  undefined1 local_90 [8];
  vec3 direction;
  vec3 pos;
  float local_70;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_68;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_58;
  double local_48;
  double local_40;
  double local_38;
  
  local_38 = cos((double)(this->rotation).field_0.field_0.x);
  dVar1 = sin((double)((this->rotation).field_0.field_0.y + 3.1415927));
  local_38 = dVar1 * local_38;
  local_48 = sin((double)(this->rotation).field_0.field_0.x);
  local_40 = cos((double)(this->rotation).field_0.field_0.x);
  dVar1 = cos((double)((this->rotation).field_0.field_0.y + 3.1415927));
  local_90._0_4_ = (undefined4)local_38;
  local_90._4_4_ = (undefined4)local_48;
  direction.field_0.field_0.x = (float)(dVar1 * local_40);
  local_38 = sin((double)((this->rotation).field_0.field_0.y + 3.1415927 + -1.5707964));
  dVar1 = cos((double)((this->rotation).field_0.field_0.y + 3.1415927 + -1.5707964));
  v = (tvec3<float,_(glm::precision)0> *)((long)&pos.field_0 + 4);
  pos.field_0.field_0.z = 0.0;
  pos.field_0.field_0.y = (float)local_38;
  local_70 = (float)dVar1;
  local_58.field_0.x = (this->rotation).field_0.field_0.z * 57.29578;
  join_0x00001240_0x00001200_ =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )glm::rotateZ<float,(glm::precision)0>(v,(float *)&local_58);
  local_58.field_0 =
       (anon_struct_12_3_4e92e0dd_for_anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2_0
        )glm::detail::compute_cross<float,_(glm::precision)0,_false>::call
                   (v,(tvec3<float,_(glm::precision)0> *)local_90);
  direction.field_0.field_0.y = (this->position).field_0.field_0.x;
  direction.field_0.field_0.z = (this->position).field_0.field_0.y;
  pos.field_0.field_0.x = (this->position).field_0.field_0.z;
  local_68.field_0.z = pos.field_0.field_0.x + direction.field_0.field_0.x;
  local_68._0_8_ =
       CONCAT44(direction.field_0.field_0.z + (float)local_90._4_4_,
                direction.field_0.field_0.y + (float)local_90._0_4_);
  glm::lookAtRH<float,(glm::precision)0>
            (__return_storage_ptr__,(glm *)((long)&direction.field_0 + 4),
             (tvec3<float,_(glm::precision)0> *)&local_68.field_0,
             (tvec3<float,_(glm::precision)0> *)&local_58.field_0,in_R8);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 Camera::getViewMatrix()
{
	float halfPI = 1.57079632679f;
	glm::vec3 direction = glm::vec3(
		cos(rotation.x) * sin(rotation.y + 3.14159265359f),
		sin(rotation.x),
		cos(rotation.x) * cos(rotation.y + 3.14159265359f)
	);
	
	glm::vec3 right = glm::vec3(
		sin(rotation.y + 3.14159265359f - halfPI),
		0,
		cos(rotation.y + 3.14159265359f - halfPI)
	);
	right = glm::rotateZ(right, rotation.z*57.2957795f );

	glm::vec3 up = glm::cross(right, direction);

	glm::vec3 pos = glm::vec3(position.x, position.y, position.z);

	return glm::lookAt(
		pos,
		pos + direction,
		up
	);
}